

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

pair<unsigned_int,_Elf64_Sym> * __thiscall
pstack::Elf::GnuHash::findSymbol
          (pair<unsigned_int,_Elf64_Sym> *__return_storage_ptr__,GnuHash *this,char *name)

{
  element_type *peVar1;
  uchar uVar2;
  uchar uVar3;
  Elf64_Section EVar4;
  Elf64_Addr EVar5;
  GnuHash *pGVar6;
  uint uVar7;
  int iVar8;
  byte *pbVar9;
  byte bVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  undefined1 auStack_88 [8];
  value_type sym;
  unsigned_long t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  GnuHash *local_50;
  char *local_48;
  pair<unsigned_int,_Elf64_Sym> *local_40;
  uint local_34 [2];
  uint t_3;
  
  bVar10 = *name;
  if (bVar10 == 0) {
    uVar11 = 0x1505;
  }
  else {
    pbVar9 = (byte *)(name + 1);
    uVar11 = 0x1505;
    do {
      uVar11 = (ulong)((int)uVar11 * 0x21 + (uint)bVar10);
      bVar10 = *pbVar9;
      pbVar9 = pbVar9 + 1;
    } while (bVar10 != 0);
  }
  local_48 = name;
  Reader::readObj<unsigned_long>
            ((this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(ulong)((int)((uVar11 >> 6) % (ulong)(this->header).bloom_size) * 8 + 0x10),
             &sym.st_size,1);
  if ((((1L << ((byte)((uint)uVar11 >> ((byte)(this->header).bloom_shift & 0x1f)) & 0x3f) |
        1L << (uVar11 & 0x3f)) & ~CONCAT44(sym.st_size._4_4_,(uint)sym.st_size)) == 0) &&
     (Reader::readObj<unsigned_int>
                ((this->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(ulong)((this->header).bloom_size * 8 +
                                (int)(uVar11 % (ulong)(this->header).nbuckets) * 4 + 0x10),
                 (uint *)&sym.st_size,1), uVar12 = (uint)sym.st_size, local_50 = this,
     local_40 = __return_storage_ptr__, (this->header).symoffset <= (uint)sym.st_size)) {
    while( true ) {
      pGVar6 = local_50;
      Reader::readObj<Elf64_Sym>
                ((local_50->syms).
                 super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (ulong)uVar12 * 0x18,(value_type *)auStack_88,1);
      Reader::readObj<unsigned_int>
                ((pGVar6->hash).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(ulong)((((pGVar6->header).nbuckets - (pGVar6->header).symoffset) + uVar12)
                                 * 4 + (pGVar6->header).bloom_size * 8 + 0x10),local_34,1);
      uVar7 = local_34[0];
      if ((local_34[0] ^ (uint)uVar11) < 2) {
        peVar1 = (pGVar6->strings).
                 super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar1->_vptr_Reader[7])(&sym.st_size,peVar1,(ulong)(uint)auStack_88._0_4_);
        iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &sym.st_size,local_48);
        bVar13 = iVar8 == 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(sym.st_size._4_4_,(uint)sym.st_size) != &local_60) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(sym.st_size._4_4_,(uint)sym.st_size),
                          local_60._M_allocated_capacity + 1);
        }
      }
      else {
        bVar13 = false;
      }
      if (bVar13) {
        local_40->first = uVar12;
        (local_40->second).st_name = auStack_88._0_4_;
        (local_40->second).st_info = (char)auStack_88._4_4_;
        (local_40->second).st_other = SUB41(auStack_88._4_4_,1);
        (local_40->second).st_shndx = SUB42(auStack_88._4_4_,2);
        (local_40->second).st_value = sym._0_8_;
        __return_storage_ptr__ = local_40;
        goto LAB_0015a897;
      }
      if ((uVar7 & 1) != 0) break;
      uVar12 = uVar12 + 1;
    }
    undef();
    __return_storage_ptr__ = local_40;
  }
  else {
    undef();
  }
  __return_storage_ptr__->first = 0;
  EVar5 = undef::theUndef.undefSym.st_value;
  uVar2 = undef::theUndef.undefSym.st_info;
  uVar3 = undef::theUndef.undefSym.st_other;
  EVar4 = undef::theUndef.undefSym.st_shndx;
  (__return_storage_ptr__->second).st_name = undef::theUndef.undefSym.st_name;
  (__return_storage_ptr__->second).st_info = uVar2;
  (__return_storage_ptr__->second).st_other = uVar3;
  (__return_storage_ptr__->second).st_shndx = EVar4;
  (__return_storage_ptr__->second).st_value = EVar5;
  sym.st_value = undef::theUndef.undefSym.st_size;
LAB_0015a897:
  (__return_storage_ptr__->second).st_size = sym.st_value;
  return __return_storage_ptr__;
}

Assistant:

std::pair<uint32_t, Sym>
GnuHash::findSymbol(const char *name) const {
    auto symhash = gnu_hash(name);

    auto bloomword = hash->readObj<Elf::Off>(bloomoff((symhash/ELF_BITS) % header.bloom_size));

    Elf::Off mask = Elf::Off(1) << symhash % ELF_BITS |
                    Elf::Off(1) << (symhash >> header.bloom_shift) % ELF_BITS;

    if ((bloomword & mask) != mask) {
       return std::make_pair(0, undef());
    }

    auto idx = hash->readObj<uint32_t>(bucketoff(symhash % header.nbuckets));
    if (idx < header.symoffset) {
        return std::make_pair(0, undef());
    }
    for (;;) {
        auto sym = syms->readObj<Sym>(idx * sizeof (Sym));
        auto chainhash = hash->readObj<uint32_t>(chainoff(idx - header.symoffset));
        if ((chainhash | 1U)  == (symhash | 1U) && strings->readString(sym.st_name) == name)
              return std::make_pair(idx, sym);
        if ((chainhash & 1U) != 0) {
           return std::make_pair(0, undef());
        }
        ++idx;
    }
}